

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filecache.c
# Opt level: O1

void h2o_filecache_clear(h2o_filecache_t *cache)

{
  uint uVar1;
  kh_cstr_t pcVar2;
  long lVar3;
  kh_opencache_set_t *pkVar4;
  uint uVar5;
  uint uVar6;
  
  pkVar4 = cache->hash;
  if (pkVar4->n_buckets != 0) {
    uVar5 = 0;
    uVar6 = 0;
    do {
      uVar1 = pkVar4->flags[uVar6 >> 4];
      if ((uVar1 >> (sbyte)(uVar5 & 0x1e) & 3) == 0) {
        pcVar2 = pkVar4->keys[uVar6];
        pkVar4->flags[uVar6 >> 4] = uVar1 | 1 << (uVar5 & 0x1e);
        pkVar4->size = pkVar4->size - 1;
        lVar3 = *(long *)(pcVar2 + -0x120);
        *(undefined8 *)(lVar3 + 8) = *(undefined8 *)(pcVar2 + -0x118);
        **(long **)(pcVar2 + -0x118) = lVar3;
        pcVar2[-0x120] = '\0';
        pcVar2[-0x11f] = '\0';
        pcVar2[-0x11e] = '\0';
        pcVar2[-0x11d] = '\0';
        pcVar2[-0x11c] = '\0';
        pcVar2[-0x11b] = '\0';
        pcVar2[-0x11a] = '\0';
        pcVar2[-0x119] = '\0';
        pcVar2[-0x118] = '\0';
        pcVar2[-0x117] = '\0';
        pcVar2[-0x116] = '\0';
        pcVar2[-0x115] = '\0';
        pcVar2[-0x114] = '\0';
        pcVar2[-0x113] = '\0';
        pcVar2[-0x112] = '\0';
        pcVar2[-0x111] = '\0';
        h2o_filecache_close_file((h2o_filecache_ref_t *)(pcVar2 + -0x130));
      }
      uVar6 = uVar6 + 1;
      pkVar4 = cache->hash;
      uVar5 = uVar5 + 2;
    } while (uVar6 != pkVar4->n_buckets);
  }
  if (pkVar4->size == 0) {
    return;
  }
  __assert_fail("kh_size(cache->hash) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/lib/common/filecache.c"
                ,0x50,"void h2o_filecache_clear(h2o_filecache_t *)");
}

Assistant:

void h2o_filecache_clear(h2o_filecache_t *cache)
{
    khiter_t iter;
    for (iter = kh_begin(cache->hash); iter != kh_end(cache->hash); ++iter) {
        if (!kh_exist(cache->hash, iter))
            continue;
        release_from_cache(cache, iter);
    }
    assert(kh_size(cache->hash) == 0);
}